

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::ListUniqueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *in_stack_000003a0;
  ExpressionState *in_stack_000003a8;
  DataChunk *in_stack_000003b0;
  
  ListAggregatesFunction<duckdb::UniqueFunctor,false>
            (in_stack_000003b0,in_stack_000003a8,in_stack_000003a0);
  return;
}

Assistant:

static void ListUniqueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1);
	ListAggregatesFunction<UniqueFunctor>(args, state, result);
}